

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall AstWalker::visitStatementAstNode(AstWalker *this,StatementAstNode *node)

{
  long local_108;
  ExpressionStatementAstNode *local_f8;
  BlockStatementAstNode *local_e8;
  ReturnStatementAstNode *local_d8;
  BreakStatementAstNode *local_c8;
  WhileStatementAstNode *local_b8;
  IfStatementAstNode *local_a8;
  AssignStatementAstNode *local_98;
  allocator<char> local_79;
  string local_78;
  long local_58;
  ExpressionStatementAstNode *expr;
  BlockStatementAstNode *block;
  ReturnStatementAstNode *returnStmt;
  BreakStatementAstNode *breakStmt;
  WhileStatementAstNode *whileStmt;
  IfStatementAstNode *ifStmt;
  AssignStatementAstNode *assign;
  DeclareStatementAstNode *declare;
  StatementAstNode *node_local;
  AstWalker *this_local;
  
  declare = (DeclareStatementAstNode *)node;
  node_local = (StatementAstNode *)this;
  if (node == (StatementAstNode *)0x0) {
    local_98 = (AssignStatementAstNode *)0x0;
  }
  else {
    local_98 = (AssignStatementAstNode *)
               __dynamic_cast(node,&StatementAstNode::typeinfo,&DeclareStatementAstNode::typeinfo,0)
    ;
  }
  assign = local_98;
  if (local_98 == (AssignStatementAstNode *)0x0) {
    if (declare == (DeclareStatementAstNode *)0x0) {
      local_a8 = (IfStatementAstNode *)0x0;
    }
    else {
      local_a8 = (IfStatementAstNode *)
                 __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                &AssignStatementAstNode::typeinfo,0);
    }
    ifStmt = local_a8;
    if (local_a8 == (IfStatementAstNode *)0x0) {
      if (declare == (DeclareStatementAstNode *)0x0) {
        local_b8 = (WhileStatementAstNode *)0x0;
      }
      else {
        local_b8 = (WhileStatementAstNode *)
                   __dynamic_cast(declare,&StatementAstNode::typeinfo,&IfStatementAstNode::typeinfo,
                                  0);
      }
      whileStmt = local_b8;
      if (local_b8 == (WhileStatementAstNode *)0x0) {
        if (declare == (DeclareStatementAstNode *)0x0) {
          local_c8 = (BreakStatementAstNode *)0x0;
        }
        else {
          local_c8 = (BreakStatementAstNode *)
                     __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                    &WhileStatementAstNode::typeinfo,0);
        }
        breakStmt = local_c8;
        if (local_c8 == (BreakStatementAstNode *)0x0) {
          if (declare == (DeclareStatementAstNode *)0x0) {
            local_d8 = (ReturnStatementAstNode *)0x0;
          }
          else {
            local_d8 = (ReturnStatementAstNode *)
                       __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                      &BreakStatementAstNode::typeinfo,0);
          }
          returnStmt = local_d8;
          if (local_d8 == (ReturnStatementAstNode *)0x0) {
            if (declare == (DeclareStatementAstNode *)0x0) {
              local_e8 = (BlockStatementAstNode *)0x0;
            }
            else {
              local_e8 = (BlockStatementAstNode *)
                         __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                        &ReturnStatementAstNode::typeinfo,0);
            }
            block = local_e8;
            if (local_e8 == (BlockStatementAstNode *)0x0) {
              if (declare == (DeclareStatementAstNode *)0x0) {
                local_f8 = (ExpressionStatementAstNode *)0x0;
              }
              else {
                local_f8 = (ExpressionStatementAstNode *)
                           __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                          &BlockStatementAstNode::typeinfo,0);
              }
              expr = local_f8;
              if (local_f8 == (ExpressionStatementAstNode *)0x0) {
                if (declare == (DeclareStatementAstNode *)0x0) {
                  local_108 = 0;
                }
                else {
                  local_108 = __dynamic_cast(declare,&StatementAstNode::typeinfo,
                                             &ExpressionStatementAstNode::typeinfo,0);
                }
                local_58 = local_108;
                if (local_108 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_78,
                             "visitStatementAstNode called with unexpected node type",&local_79);
                  Error::assertWithPanic(false,&local_78);
                  std::__cxx11::string::~string((string *)&local_78);
                  std::allocator<char>::~allocator(&local_79);
                }
                else {
                  (*this->_vptr_AstWalker[0x12])(this,local_108);
                }
              }
              else {
                (*this->_vptr_AstWalker[0xb])(this,local_f8);
              }
            }
            else {
              (*this->_vptr_AstWalker[10])(this,local_e8);
            }
          }
          else {
            (*this->_vptr_AstWalker[9])(this,local_d8);
          }
        }
        else {
          (*this->_vptr_AstWalker[8])(this,local_c8);
        }
      }
      else {
        (*this->_vptr_AstWalker[7])(this,local_b8);
      }
    }
    else {
      (*this->_vptr_AstWalker[6])(this,local_a8);
    }
  }
  else {
    (*this->_vptr_AstWalker[5])(this,local_98);
  }
  return;
}

Assistant:

void AstWalker::visitStatementAstNode(StatementAstNode* node) noexcept {

  auto declare = dynamic_cast<DeclareStatementAstNode*>(node);
  if (declare != nullptr) {
    this->visitDeclareStatementAstNode(declare);
    return;
  }

  auto assign = dynamic_cast<AssignStatementAstNode*>(node);
  if (assign != nullptr) {
    this->visitAssignStatementAstNode(assign);
    return;
  }

  auto ifStmt = dynamic_cast<IfStatementAstNode*>(node);
  if (ifStmt != nullptr) {
    this->visitIfStatementAstNode(ifStmt);
    return;
  }

  auto whileStmt = dynamic_cast<WhileStatementAstNode*>(node);
  if (whileStmt != nullptr) {
    this->visitWhileStatementAstNode(whileStmt);
    return;
  }

  auto breakStmt = dynamic_cast<BreakStatementAstNode*>(node);
  if (breakStmt != nullptr) {
    this->visitBreakStatementAstNode(breakStmt);
    return;
  }

  auto returnStmt = dynamic_cast<ReturnStatementAstNode*>(node);
  if (returnStmt != nullptr) {
    this->visitReturnStatementAstNode(returnStmt);
    return;
  }

  auto block = dynamic_cast<BlockStatementAstNode*>(node);
  if (block != nullptr) {
    this->visitBlockStatementAstNode(block);
    return;
  }

  auto expr = dynamic_cast<ExpressionStatementAstNode*>(node);
  if (expr != nullptr) {
    this->visitExpressionStatementAstNode(expr);
    return;
  }

  Error::assertWithPanic(false, "visitStatementAstNode called with unexpected node type");
}